

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.c
# Opt level: O2

int katherine_get_readout_status(katherine_device_t *device,katherine_readout_status_t *status)

{
  int iVar1;
  char in_RAX [8];
  char crd [8];
  
  crd = in_RAX;
  iVar1 = katherine_cmd6(&device->control_socket,'\x17');
  if (iVar1 == 0) {
    iVar1 = katherine_cmd_wait_ack_crd(&device->control_socket,crd);
    if (iVar1 == 0) {
      status->hw_type = crd._0_4_ & 0xff;
      status->hw_revision = crd._1_4_ & 0xff;
      status->hw_serial_number = crd._2_4_ & 0xffff;
      status->fw_version = crd._4_4_ & 0xffff;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int
katherine_get_readout_status(katherine_device_t *device, katherine_readout_status_t *status)
{
    int res;

    res = katherine_cmd_get_readout_status(&device->control_socket);
    if (res) goto err;

    char crd[8];
    res = katherine_cmd_wait_ack_crd(&device->control_socket, crd);
    if (res) goto err;

    const uint64_t *status_crd = (const uint64_t *) &crd;
    status->hw_type             = EXTRACT(*status_crd, readout_status_crd, hw_type);
    status->hw_revision         = EXTRACT(*status_crd, readout_status_crd, hw_revision);
    status->hw_serial_number    = EXTRACT(*status_crd, readout_status_crd, hw_serial_number);
    status->fw_version          = EXTRACT(*status_crd, readout_status_crd, fw_version);

    return 0;

err:
    return res;
}